

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lecturedemoassemble.cc
# Opt level: O3

Matrix<double,_3,_3,_0,_3,_3> * __thiscall
lecturedemo::LinFELaplaceElemMatProvider::Eval
          (Matrix<double,_3,_3,_0,_3,_3> *__return_storage_ptr__,LinFELaplaceElemMatProvider *this,
          Entity *tria)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  non_const_type pMVar2;
  double *pdVar3;
  long lVar4;
  undefined1 uVar5;
  int iVar6;
  long *plVar7;
  MatrixXd *pMVar8;
  runtime_error *this_00;
  ostream *poVar9;
  Matrix<double,_3,_3,_0,_3,_3> X;
  SrcEvaluatorType srcEvaluator;
  MatrixXd vertices;
  DstEvaluatorType dstEvaluator;
  stringstream ss;
  Matrix<double,_2,_3,_0,_2,_3> grad_bary_coords;
  assign_op<double,_double> local_369;
  undefined1 local_368 [24];
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  string local_320;
  Matrix<double,_2,_3,_0,_2,_3> *local_300;
  long local_2f8;
  long lStack_2f0;
  undefined8 local_2e8;
  block_evaluator<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true> local_2e0;
  undefined1 local_2d0 [40];
  Matrix<double,_2,_3,_0,_2,_3> *local_2a8;
  double local_298;
  Matrix<double,_2,_3,_0,_2,_3> *local_288;
  Matrix<double,_2,_3,_0,_2,_3> *local_280;
  undefined8 local_278;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_240;
  double local_238;
  Matrix<double,__1,__1,_0,__1,__1> local_230;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_2,_1,_3,_2>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_218;
  pointer local_1f8;
  undefined8 uStack_1f0;
  plainobjectbase_evaluator_data<double,_3> local_1e8;
  undefined1 local_1e0 [16];
  XprTypeNested local_1d0;
  variable_if_dynamic<long,__1> local_1c8;
  variable_if_dynamic<long,__1> local_1c0;
  Index local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  XprType local_198 [6];
  Matrix<double,_2,_3,_0,_2,_3> local_58;
  undefined4 extraout_var;
  
  iVar6 = (*tria->_vptr_Entity[4])(tria);
  if ((char)iVar6 != '\x03') {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d0,"Unsupported cell type ",0x16);
    iVar6 = (*tria->_vptr_Entity[4])(tria);
    local_2d0[0] = (char)iVar6;
    lf::base::operator<<((ostream *)&local_1d0,(RefEl *)local_2d0);
    local_2d0._0_8_ = (non_const_type)(local_2d0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2d0,"tria.RefEl() == lf::base::RefEl::kTria()","");
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemoassemble.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_2d0,&local_320,0x16,(string *)local_368);
    if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
      operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((non_const_type)local_2d0._0_8_ != (non_const_type)(local_2d0 + 0x10)) {
      operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar6 = (*tria->_vptr_Entity[3])(tria);
  plVar7 = (long *)CONCAT44(extraout_var,iVar6);
  uVar5 = (**(code **)(*plVar7 + 0x10))(plVar7);
  local_1e0[0] = uVar5;
  pMVar8 = lf::base::RefEl::NodeCoords((RefEl *)local_1e0);
  (**(code **)(*plVar7 + 0x18))(&local_230,plVar7,pMVar8);
  if ((local_230.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       == 3) &&
     (local_230.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows ==
      2)) {
    local_1e0._0_8_ = &local_350;
    local_368._0_8_ = &DAT_3ff0000000000000;
    local_368._8_8_ = 1.0;
    local_368._16_8_ = 1.0;
    local_1c8.m_value = 0;
    local_1c0.m_value = 1;
    local_1b8 = 3;
    local_2d0._0_8_ = &local_230;
    local_1d0 = (XprTypeNested)local_368;
    Eigen::internal::
    checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_2,_false>,_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_true>
    ::run((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_2,_false> *)local_1e0,
          (Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2d0);
    pdVar3 = *(double **)local_2d0._0_8_;
    lVar4 = *(Index *)(local_2d0._0_8_ + 8);
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,2,false>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_2,_false> *)local_1e0,
               (Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2d0,
               (assign_op<double,_double> *)&local_320);
    *(double *)local_1e0._0_8_ = *pdVar3;
    *(double *)(local_1e0._0_8_ + 8) = pdVar3[lVar4];
    *(double *)(local_1e0._0_8_ + 0x10) = pdVar3[lVar4 * 2];
    *(double *)(local_1e0._0_8_ + 0x18) = pdVar3[1];
    *(double *)(local_1e0._0_8_ + 0x20) = pdVar3[lVar4 + 1];
    *(double *)(local_1e0._0_8_ + 0x28) = pdVar3[lVar4 * 2 + 1];
    local_1f8 = (pointer)local_368._0_8_;
    uStack_1f0 = 0;
    local_238 = (double)local_368._8_8_;
    local_268 = local_348;
    local_250 = local_328;
    local_260 = local_330;
    local_270 = local_340;
    local_248 = local_350;
    local_258 = (double)local_368._16_8_;
    local_240 = local_338;
    local_2d0._8_8_ = 1;
    local_2d0._16_8_ = 0;
    local_2d0._0_8_ = (XprTypeNested)local_368;
    local_1e0._0_8_ = (Matrix<double,_3,_3,_0,_3,_3> *)(local_1e0 + 8);
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,_3,_3,_0,_3,_3> *)(local_1e0 + 8),(SrcXprType *)local_2d0,
          (assign_op<double,_double> *)&local_320);
    local_320.field_2._M_allocated_capacity =
         (size_type)
         (ABS(((double)local_1f8 * (local_268 * local_250 - local_270 * local_260) -
              local_248 * (local_238 * local_250 - local_258 * local_260)) +
              local_240 * (local_238 * local_270 - local_258 * local_268)) * 0.5);
    local_198[0].
    super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>._8_8_ =
         local_2d0._8_8_;
    pdVar3 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1e0._0_8_)->m_storage
             ).m_data.array + local_2d0._8_8_ + local_2d0._16_8_ * 3;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[0]
         = *pdVar3;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[1]
         = pdVar3[1];
    local_300 = &local_58;
    pdVar3 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1e0._0_8_)->m_storage
             ).m_data.array + local_2d0._8_8_ + local_2d0._16_8_ * 3 + 3;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[2]
         = *pdVar3;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[3]
         = pdVar3[1];
    pdVar3 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1e0._0_8_)->m_storage
             ).m_data.array + local_2d0._8_8_ + local_2d0._16_8_ * 3 + 6;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[4]
         = *pdVar3;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[5]
         = pdVar3[1];
    local_278 = 2;
    local_218.m_dst = (DstEvaluatorType *)&local_1e8;
    local_218.m_functor = &local_369;
    local_1b0 = 0;
    uStack_1a8 = 0;
    local_198[0].
    super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.m_startRow.
    m_value = 0;
    local_198[0].
    super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.m_startCol.
    m_value = 0;
    local_198[0].
    super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
    m_outerStride = 2;
    local_2f8 = 0;
    lStack_2f0 = 0;
    local_2e8 = 0;
    local_2d0._16_8_ = local_320.field_2._M_allocated_capacity;
    local_2d0._24_8_ = local_300;
    local_2a8 = local_300;
    local_298 = (double)local_320.field_2._M_allocated_capacity;
    local_288 = local_300;
    local_280 = local_300;
    local_218.m_src = (SrcEvaluatorType *)local_2d0;
    local_218.m_dstExpr = __return_storage_ptr__;
    local_1e8.data = (double *)__return_storage_ptr__;
    local_1c8.m_value = local_320.field_2._M_allocated_capacity;
    local_1c0.m_value = (long)local_300;
    local_198[0].
    super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_0>.m_data =
         (PointerType)local_300;
    local_198[0].
    super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>.m_xpr =
         local_300;
    Eigen::internal::block_evaluator<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>::
    block_evaluator(&local_2e0,local_198);
    pdVar3 = (local_300->super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>).m_storage.
             m_data.array + lStack_2f0 + local_2f8 * 2;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[0] =
         local_2e0.
         super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
         .m_data[1] * pdVar3[1] * (double)local_320.field_2._M_allocated_capacity +
         *local_2e0.
          super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
          .m_data * *pdVar3 * (double)local_320.field_2._M_allocated_capacity;
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_2,_1,_3,_2>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1,_9>
    ::run(&local_218);
    free(local_230.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1d0,"Invalid vertex coordinate ",0x1a);
  poVar9 = std::ostream::_M_insert<long>((long)&local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
  poVar9 = std::ostream::_M_insert<long>((long)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," matrix",7);
  pMVar2 = (non_const_type)(local_2d0 + 0x10);
  local_2d0._0_8_ = pMVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,"(vertices.cols() == 3) && (vertices.rows() == 2)","");
  paVar1 = &local_320.field_2;
  local_320._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemoassemble.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  lf::base::AssertionFailed((string *)local_2d0,&local_320,0x1b,(string *)local_368);
  if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
    operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((non_const_type)local_2d0._0_8_ != pMVar2) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  local_2d0._0_8_ = pMVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"false","");
  local_320._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemoassemble.cc"
             ,"");
  local_368._0_8_ = local_368 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"");
  lf::base::AssertionFailed((string *)local_2d0,&local_320,0x1b,(string *)local_368);
  std::__cxx11::string::~string((string *)local_368);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)local_2d0);
  abort();
}

Assistant:

Eigen::Matrix<double, 3, 3> LinFELaplaceElemMatProvider::Eval( // NOLINT
    const lf::mesh::Entity &tria) {
    // Throw error in case no triangular cell
    LF_VERIFY_MSG(tria.RefEl() == lf::base::RefEl::kTria(),
		  "Unsupported cell type " << tria.RefEl());
    // Obtain vertex coordinates of the triangle in a 2x3 matrix
    const auto vertices = lf::geometry::Corners(*(tria.Geometry()));
    LF_ASSERT_MSG((vertices.cols() == 3) && (vertices.rows() == 2),
		  "Invalid vertex coordinate " << vertices.rows() << "x"
		  << vertices.cols() << " matrix");

    // Set up an auxiliary 3x3-matrix with a leading column 1 and
    // the vertex coordinates in its right 3x2 block
    Eigen::Matrix<double, 3, 3> X;  // temporary matrix
    X.block<3, 1>(0, 0) = Eigen::Vector3d::Ones();
    X.block<3, 2>(0, 1) = vertices.transpose();
    // The determinant of the auxiliary matrix also supplies the determinant
    const double area = 0.5 * std::abs(X.determinant());
    // Compute the gradients of the barycentric coordinate functions
    // and store them in the columns of a 2x3 matrix grad\_bary\_coords
    Eigen::Matrix<double, 2, 3>
      grad_bary_coords{X.inverse().block<2, 3>(1, 0)};

    // Since the gradients are constant, local integration is easy
    return ((area * grad_bary_coords.transpose()) * grad_bary_coords);
  }